

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_buffered_stream.h
# Opt level: O0

bool google::protobuf::json_internal::operator==(MaybeOwnedString *lhs,char (*rhs) [10])

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  char (*local_18) [10];
  char (*rhs_local) [10];
  MaybeOwnedString *lhs_local;
  
  local_18 = rhs;
  rhs_local = (char (*) [10])lhs;
  local_28 = MaybeOwnedString::AsView(lhs);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,*local_18);
  bVar1 = std::operator==(local_28,local_38);
  return bVar1;
}

Assistant:

bool operator==(const MaybeOwnedString& lhs, const String& rhs) {
    return lhs.AsView() == rhs;
  }